

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O0

size_t andres::graph::
       labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>&>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
                 SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                 *mask,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       labeling)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  reference pvVar4;
  pointer pAVar5;
  Value VVar6;
  reference puVar7;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  *in_RSI;
  reference rVar8;
  reference rVar9;
  AdjacencyIterator it;
  size_t w;
  size_t v;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  vector<bool,_std::allocator<bool>_> visited;
  size_t label;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffe48;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  *pSVar10;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe50;
  allocator_type *in_stack_fffffffffffffe58;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  *in_stack_fffffffffffffe60;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  *in_stack_fffffffffffffe68;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe70;
  byte local_171;
  reference local_118;
  Value local_108;
  reference local_100;
  Adjacency<unsigned_long> *local_f0;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_e8;
  value_type local_e0;
  reference local_d8;
  reference local_c8;
  ulong local_b8;
  undefined1 local_49;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  *local_20;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
  *local_18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8;
  
  local_20 = (SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              *)0x0;
  local_18 = in_RSI;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1b7a38);
  local_49 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x1b7a5d);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68,
             (bool *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1b7a91);
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(in_stack_fffffffffffffe50);
  rVar9._M_mask = (_Bit_type)in_stack_fffffffffffffe50;
  rVar9._M_p = (_Bit_type *)in_stack_fffffffffffffe58;
  local_b8 = 0;
  while( true ) {
    uVar1 = local_b8;
    sVar3 = Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
                      ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1b7ac9);
    if (sVar3 <= uVar1) break;
    bVar2 = lineage::ProblemGraph::
            SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ::vertex(local_18,local_b8);
    if (bVar2) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
      local_c8 = rVar8;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      pSVar10 = local_20;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator[](&local_8,local_b8);
        *puVar7 = (unsigned_long)pSVar10;
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)rVar9._M_mask,(value_type *)in_stack_fffffffffffffe48);
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
        local_d8 = rVar8;
        std::_Bit_reference::operator=(&local_d8,true);
        while( true ) {
          bVar2 = std::
                  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)0x1b7bf9);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          pvVar4 = std::
                   queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::front((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)0x1b7c11);
          local_e0 = *pvVar4;
          std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                    ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)0x1b7c29);
          local_e8._M_current =
               (Adjacency<unsigned_long> *)
               Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesFromVertexBegin
                         (in_stack_fffffffffffffe48,0x1b7c3e);
          while( true ) {
            local_f0 = (Adjacency<unsigned_long> *)
                       Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                       adjacenciesFromVertexEnd(in_stack_fffffffffffffe48,0x1b7c5b);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)rVar9._M_mask,
                               (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffe48);
            if (!bVar2) break;
            pAVar5 = __gnu_cxx::
                     __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                     ::operator->(&local_e8);
            Adjacency<unsigned_long>::edge(pAVar5);
            bVar2 = lineage::ProblemGraph::
                    SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                    ::edge(in_stack_fffffffffffffe60,(size_t)rVar9._M_p);
            pSVar10 = local_18;
            local_171 = 0;
            if (bVar2) {
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(&local_e8);
              VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
              bVar2 = lineage::ProblemGraph::
                      SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                      ::vertex(pSVar10,VVar6);
              local_171 = 0;
              if (bVar2) {
                pAVar5 = __gnu_cxx::
                         __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                         ::operator->(&local_e8);
                Adjacency<unsigned_long>::vertex(pAVar5);
                rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
                in_stack_fffffffffffffe70 = (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask;
                local_100 = rVar8;
                bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_100);
                local_171 = bVar2 ^ 0xff;
              }
            }
            if ((local_171 & 1) != 0) {
              in_stack_fffffffffffffe68 = &local_e8;
              in_stack_fffffffffffffe60 = local_20;
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(in_stack_fffffffffffffe68);
              VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
              puVar7 = __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator[](&local_8,VVar6);
              *puVar7 = (unsigned_long)in_stack_fffffffffffffe60;
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(in_stack_fffffffffffffe68);
              local_108 = Adjacency<unsigned_long>::vertex(pAVar5);
              std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::push((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)rVar9._M_mask,(value_type *)in_stack_fffffffffffffe48);
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(&local_e8);
              Adjacency<unsigned_long>::vertex(pAVar5);
              rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68);
              local_118 = rVar9;
              std::_Bit_reference::operator=(&local_118,true);
            }
            __gnu_cxx::
            __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
            ::operator++(&local_e8);
          }
        }
        local_20 = (SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                    *)((long)&local_20->problem_ + 1);
      }
    }
    else {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_8,local_b8);
      *puVar7 = 0;
    }
    local_b8 = local_b8 + 1;
  }
  pSVar10 = local_20;
  std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~queue
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x1b7f2e);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1b7f3b)
  ;
  return (size_t)pSVar10;
}

Assistant:

std::size_t
labelComponents(
    const GRAPH& graph,
    const SUBGRAPH_MASK& mask,
    ITERATOR labeling
) {
    std::size_t label = 0;
    std::vector<bool> visited(graph.numberOfVertices(), false);
    std::queue<std::size_t> queue;
    for(std::size_t v = 0; v < graph.numberOfVertices(); ++v) {
        if(mask.vertex(v)) {
            if(!visited[v]) {
                labeling[v] = label; // label
                queue.push(v);
                visited[v] = true;
                while(!queue.empty()) {
                    std::size_t w = queue.front();
                    queue.pop();
                    for(typename GRAPH::AdjacencyIterator it = graph.adjacenciesFromVertexBegin(w);
                    it != graph.adjacenciesFromVertexEnd(w); ++it) {
                        if(mask.edge(it->edge()) 
                        && mask.vertex(it->vertex()) 
                        && !visited[it->vertex()]) {
                            labeling[it->vertex()] = label; // label
                            queue.push(it->vertex());
                            visited[it->vertex()] = true;
                        }
                    }
                }
                label++;
            }
        }
        else {
            labeling[v] = 0;
        }
    }
    return label;
}